

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentStorageBuffer::~RenderFragmentStorageBuffer
          (RenderFragmentStorageBuffer *this)

{
  DeviceInterface *pDVar1;
  VkDescriptorPool obj;
  VkPipelineLayout obj_00;
  VkDescriptorSetLayout obj_01;
  VkPipeline obj_02;
  
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentStorageBuffer_00d27ca8;
  if ((this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
      m_internal != 0) {
    pDVar1 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    (*pDVar1->_vptr_DeviceInterface[0x3d])
              (pDVar1,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
  }
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = 0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       0;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_00.m_internal =
       (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
       object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                m_data.deleter,obj_00);
  }
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
  m_internal = 0;
  (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_01.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&(this->m_resources).descriptorSetLayout.
                super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter,obj_01);
  }
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_device = (VkDevice)0x0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  object.m_internal = 0;
  (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
  deleter.m_deviceIface = (DeviceInterface *)0x0;
  obj_02.m_internal =
       (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
       m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                deleter,obj_02);
  }
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
  m_internal = 0;
  (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  return;
}

Assistant:

RenderFragmentStorageBuffer::~RenderFragmentStorageBuffer (void)
{
}